

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O2

void __thiscall FParser::SF_KillInSector(FParser *this)

{
  bool bVar1;
  int tag;
  AActor *target;
  DAngle angle;
  FName local_54;
  undefined8 local_50;
  TThinkerIterator<AActor> it;
  
  bVar1 = CheckArgs(this,1);
  if (bVar1) {
    TThinkerIterator<AActor>::TThinkerIterator
              ((TThinkerIterator<AActor> *)&it.super_FThinkerIterator,0x80);
    tag = intvalue(this->t_argv);
    while( true ) {
      target = (AActor *)FThinkerIterator::Next(&it.super_FThinkerIterator,false);
      if (target == (AActor *)0x0) break;
      if (((target->flags3).Value & 0x2000) != 0) {
        bVar1 = FTagManager::SectorHasTag(&tagManager,target->Sector,tag);
        if (bVar1) {
          local_54.Index = 0xca;
          local_50 = 0;
          P_DamageMobj(target,(AActor *)0x0,(AActor *)0x0,1000000,&local_54,0,angle);
        }
      }
    }
  }
  return;
}

Assistant:

void  FParser::SF_KillInSector()
{
	if (CheckArgs(1))
	{
		TThinkerIterator<AActor> it;
		AActor * mo;
		int tag=intvalue(t_argv[0]);

		while ((mo=it.Next()))
		{
			if (mo->flags3&MF3_ISMONSTER && tagManager.SectorHasTag(mo->Sector, tag)) P_DamageMobj(mo, NULL, NULL, 1000000, NAME_Massacre);
		}
	}
}